

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O0

void __thiscall
miniros::IntraProcessSubscriberLink::enqueueMessage
          (IntraProcessSubscriberLink *this,SerializedMessage *m,bool ser,bool nocopy)

{
  element_type *peVar1;
  byte in_CL;
  byte in_DL;
  undefined8 in_RSI;
  scoped_lock<std::recursive_mutex> *in_RDI;
  scoped_lock<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock(in_RDI,in_stack_ffffffffffffffb8);
  if (((ulong)in_RDI[0x13]._M_device & 1) == 0) {
    peVar1 = std::
             __shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x451ce3);
    (*(peVar1->super_PublisherLink)._vptr_PublisherLink[2])
              (peVar1,in_RSI,(ulong)(in_DL & 1),(ulong)(in_CL & 1));
  }
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x451d18);
  return;
}

Assistant:

void IntraProcessSubscriberLink::enqueueMessage(const SerializedMessage& m, bool ser, bool nocopy)
{
  std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
  if (dropped_)
  {
    return;
  }

  MINIROS_ASSERT(subscriber_);
  subscriber_->handleMessage(m, ser, nocopy);
}